

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_factory.cpp
# Opt level: O0

sink_ptr __thiscall
bidfx_public_api::tools::LoggerFactory::AddDailyFileLogger
          (LoggerFactory *this,string *base_filename)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  sink_ptr sVar1;
  int local_34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  string *base_filename_local;
  sink_ptr *sink;
  
  local_30.field_2._M_local_buf[7] = '\0';
  local_34 = 0;
  local_30.field_2._8_8_ = base_filename;
  base_filename_local = (string *)this;
  std::
  make_shared<spdlog::sinks::daily_file_sink<std::mutex,spdlog::sinks::daily_filename_calculator>,std::__cxx11::string&,int,int>
            (&local_30,(int *)base_filename,&local_34);
  std::shared_ptr<spdlog::sinks::sink>::
  shared_ptr<spdlog::sinks::daily_file_sink<std::mutex,spdlog::sinks::daily_filename_calculator>,void>
            ((shared_ptr<spdlog::sinks::sink> *)this,
             (shared_ptr<spdlog::sinks::daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator>_>
              *)&local_30);
  std::
  shared_ptr<spdlog::sinks::daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator>_>
  ::~shared_ptr((shared_ptr<spdlog::sinks::daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator>_>
                 *)&local_30);
  AddSink((sink_ptr *)this);
  sVar1.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (sink_ptr)sVar1.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

spdlog::sink_ptr LoggerFactory::AddDailyFileLogger(std::string base_filename)
{
    spdlog::sink_ptr sink = std::make_shared<spdlog::sinks::daily_file_sink_mt>(base_filename, 0, 0);
    AddSink(sink);
    return sink;
}